

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

void ResolveFauxBackbufferMSAA(void)

{
  GLboolean GVar1;
  
  GVar1 = (*OpenGLFuncs.glIsEnabled)(0xc11);
  if (GVar1 == '\0') {
    (*OpenGLFuncs.glBindFramebuffer)(0x8ca8,OpenGLLogicalScalingFBO);
    (*OpenGLFuncs.glBindFramebuffer)(0x8ca9,OpenGLLogicalScalingMultisampleFBO);
    (*OpenGLFuncs.glBlitFramebuffer)
              (0,0,OpenGLLogicalScalingWidth,OpenGLLogicalScalingHeight,0,0,
               OpenGLLogicalScalingWidth,OpenGLLogicalScalingHeight,0x4000,0x2600);
  }
  else {
    (*OpenGLFuncs.glDisable)(0xc11);
    (*OpenGLFuncs.glBindFramebuffer)(0x8ca8,OpenGLLogicalScalingFBO);
    (*OpenGLFuncs.glBindFramebuffer)(0x8ca9,OpenGLLogicalScalingMultisampleFBO);
    (*OpenGLFuncs.glBlitFramebuffer)
              (0,0,OpenGLLogicalScalingWidth,OpenGLLogicalScalingHeight,0,0,
               OpenGLLogicalScalingWidth,OpenGLLogicalScalingHeight,0x4000,0x2600);
    (*OpenGLFuncs.glEnable)(0xc11);
  }
  (*OpenGLFuncs.glBindFramebuffer)(0x8ca8,OpenGLCurrentReadFBO);
  (*OpenGLFuncs.glBindFramebuffer)(0x8ca9,OpenGLCurrentDrawFBO);
  return;
}

Assistant:

static void
ResolveFauxBackbufferMSAA()
{
    const GLboolean has_scissor = OpenGLFuncs.glIsEnabled(GL_SCISSOR_TEST);

    if (has_scissor) {
        OpenGLFuncs.glDisable(GL_SCISSOR_TEST);  /* scissor test affects framebuffer_blit */
    }

    OpenGLFuncs.glBindFramebuffer(GL_READ_FRAMEBUFFER, OpenGLLogicalScalingFBO);
    OpenGLFuncs.glBindFramebuffer(GL_DRAW_FRAMEBUFFER, OpenGLLogicalScalingMultisampleFBO);
    OpenGLFuncs.glBlitFramebuffer(0, 0, OpenGLLogicalScalingWidth, OpenGLLogicalScalingHeight,
                                  0, 0, OpenGLLogicalScalingWidth, OpenGLLogicalScalingHeight,
                                  GL_COLOR_BUFFER_BIT, GL_NEAREST);

    if (has_scissor) {
        OpenGLFuncs.glEnable(GL_SCISSOR_TEST);
    }
    OpenGLFuncs.glBindFramebuffer(GL_READ_FRAMEBUFFER, OpenGLCurrentReadFBO);
    OpenGLFuncs.glBindFramebuffer(GL_DRAW_FRAMEBUFFER, OpenGLCurrentDrawFBO);
}